

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int op_mem_read(void *_stream,uchar *_ptr,int _buf_size)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if (0 < _buf_size) {
    lVar1 = *(long *)((long)_stream + 0x10);
    uVar2 = *(long *)((long)_stream + 8) - lVar1;
    if (uVar2 != 0 && lVar1 <= *(long *)((long)_stream + 8)) {
      uVar4 = (ulong)(uint)_buf_size;
      if ((long)uVar2 < (long)(ulong)(uint)_buf_size) {
        uVar4 = uVar2;
      }
      iVar3 = (int)uVar4;
      memcpy(_ptr,(void *)(*_stream + lVar1),(long)iVar3);
      *(long *)((long)_stream + 0x10) = iVar3 + lVar1;
    }
  }
  return iVar3;
}

Assistant:

static int op_mem_read(void *_stream,unsigned char *_ptr,int _buf_size){
  OpusMemStream *stream;
  ptrdiff_t      size;
  ptrdiff_t      pos;
  stream=(OpusMemStream *)_stream;
  /*Check for empty read.*/
  if(_buf_size<=0)return 0;
  size=stream->size;
  pos=stream->pos;
  /*Check for EOF.*/
  if(pos>=size)return 0;
  /*Check for a short read.*/
  _buf_size=(int)OP_MIN(size-pos,_buf_size);
  memcpy(_ptr,stream->data+pos,_buf_size);
  pos+=_buf_size;
  stream->pos=pos;
  return _buf_size;
}